

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseColEtree.h
# Opt level: O1

int Eigen::internal::coletree<Eigen::SparseMatrix<double,0,int>,Eigen::Matrix<int,_1,1,0,_1,1>>
              (SparseMatrix<double,_0,_int> *mat,Matrix<int,__1,_1,_0,__1,_1> *parent,
              Matrix<int,__1,_1,_0,__1,_1> *firstRowElt,Index *perm)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  Index *pIVar4;
  Index *pIVar5;
  Index *pIVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  Index size;
  long size_00;
  undefined8 *puVar12;
  long lVar13;
  ulong uVar14;
  Index alignedEnd;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  Index IVar20;
  ulong uVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  Matrix<int,__1,_1,_0,__1,_1> local_58;
  Matrix<int,__1,_1,_0,__1,_1> *local_48;
  void *local_40;
  ulong local_38;
  Index othersize;
  
  uVar11 = mat->m_outerSize;
  uVar21 = (ulong)(int)uVar11;
  uVar2 = mat->m_innerSize;
  size_00 = (long)(int)uVar2;
  uVar10 = uVar11;
  if ((int)uVar2 < (int)uVar11) {
    uVar10 = uVar2;
  }
  if (uVar21 == 0) {
    local_40 = (void *)0x0;
  }
  else if (((int)uVar11 < 0) || (local_40 = malloc(uVar21 * 4), local_40 == (void *)0x0)) {
    puVar12 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar12 = std::streambuf::xsgetn;
    __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((int)uVar11 < 0) {
    __assert_fail("dim >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                  ,0xe1,
                  "Eigen::Matrix<int, -1, 1>::Matrix(Index) [_Scalar = int, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                 );
  }
  uVar14 = (ulong)(uVar11 & 0x7ffffffc);
  local_38 = uVar21;
  if (3 < (int)uVar11) {
    memset(local_40,0,uVar14 * 4);
  }
  uVar21 = local_38;
  local_48 = (Matrix<int,__1,_1,_0,__1,_1> *)(local_38 >> 2);
  if ((long)uVar14 < (long)local_38) {
    memset((void *)((long)local_40 + (long)local_48 * 0x10),0,local_38 * 4 + (long)local_48 * -0x10)
    ;
  }
  if ((int)uVar21 == 0) {
    local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)0x0;
  }
  else {
    local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (int *)malloc(uVar21 * 4);
    if (local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
        (int *)0x0) {
      puVar12 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar12 = std::streambuf::xsgetn;
      __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar21;
  if (3 < (int)uVar21) {
    uVar21 = 0;
    do {
      *(undefined1 (*) [16])
       (local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
       uVar21) = (undefined1  [16])0x0;
      uVar21 = uVar21 + 4;
    } while (uVar21 < uVar14);
  }
  if ((long)uVar14 < (long)local_38) {
    memset(local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data +
           (long)local_48 * 4,0,local_38 * 4 + (long)local_48 * -0x10);
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,
             (long)mat->m_outerSize);
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,size_00);
  uVar21 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if ((long)uVar21 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<int>, MatrixType = Eigen::Matrix<int, -1, 1>]"
                 );
  }
  PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
            (&firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>,uVar21,1);
  uVar14 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  if (uVar14 != uVar21) {
    __assert_fail("rows() == other.rows() && cols() == other.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Assign.h"
                  ,0x1f2,
                  "Derived &Eigen::DenseBase<Eigen::Matrix<int, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<int, -1, 1>, OtherDerived = Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>, Eigen::Matrix<int, -1, 1>>]"
                 );
  }
  uVar21 = uVar14 + 3;
  if (-1 < (long)uVar14) {
    uVar21 = uVar14;
  }
  uVar21 = uVar21 & 0xfffffffffffffffc;
  if (3 < (long)uVar14) {
    lVar13 = 0;
    do {
      piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
               m_data + lVar13;
      *piVar3 = (uint)local_38;
      piVar3[1] = (uint)local_38;
      piVar3[2] = (uint)local_38;
      piVar3[3] = (uint)local_38;
      lVar13 = lVar13 + 4;
    } while (lVar13 < (long)uVar21);
  }
  if ((long)uVar21 < (long)uVar14) {
    piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      piVar3[uVar21] = (uint)local_38;
      uVar21 = uVar21 + 1;
    } while (uVar14 != uVar21);
  }
  piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
           m_data;
  if ((int)uVar10 < 0 && piVar3 != (int *)0x0) {
    __assert_fail("(dataPtr == 0) || ( nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/MapBase.h"
                  ,0x94,
                  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>, Level = 0]"
                 );
  }
  if (((int)uVar10 < 0) ||
     (uVar21 = (ulong)(int)uVar10,
     (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
     (long)uVar21)) {
    __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                  ,0x8d,
                  "Eigen::Block<Eigen::Matrix<int, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<int, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  uVar11 = (uint)(uVar10 != 1);
  iVar22 = uVar11 * -4;
  iVar24 = uVar11 * -2;
  iVar23 = uVar11 * -3;
  iVar25 = -uVar11;
  uVar14 = uVar21;
  if ((((ulong)piVar3 & 3) == 0) &&
     (uVar14 = (ulong)(-((uint)((ulong)piVar3 >> 2) & 0x3fffffff) & 3), (long)uVar21 <= (long)uVar14
     )) {
    uVar14 = uVar21;
  }
  uVar16 = uVar21 - uVar14;
  uVar15 = uVar16 + 3;
  if (-1 < (long)uVar16) {
    uVar15 = uVar16;
  }
  if (0 < (long)uVar14) {
    uVar17 = 0;
    do {
      iVar19 = 0;
      if (uVar10 != 1) {
        iVar19 = (int)uVar17;
      }
      iVar22 = iVar22 + uVar11;
      iVar23 = iVar23 + uVar11;
      iVar24 = iVar24 + uVar11;
      iVar25 = iVar25 + uVar11;
      piVar3[uVar17] = iVar19;
      uVar17 = uVar17 + 1;
    } while (uVar14 != uVar17);
  }
  lVar13 = (uVar15 & 0xfffffffffffffffc) + uVar14;
  if (3 < (long)uVar16) {
    uVar16 = uVar14;
    do {
      iVar22 = iVar22 + uVar11 * 4;
      iVar23 = iVar23 + uVar11 * 4;
      iVar24 = iVar24 + uVar11 * 4;
      iVar25 = iVar25 + uVar11 * 4;
      piVar1 = piVar3 + uVar16;
      *piVar1 = iVar22;
      piVar1[1] = iVar23;
      piVar1[2] = iVar24;
      piVar1[3] = iVar25;
      uVar16 = uVar16 + 4;
    } while ((long)uVar16 < lVar13);
  }
  if (lVar13 < (long)uVar21) {
    do {
      iVar22 = (int)((long)uVar15 >> 2) * 4 + (int)uVar14;
      if (uVar10 == 1) {
        iVar22 = 0;
      }
      piVar3[((long)uVar15 >> 2) * 4 + uVar14] = iVar22;
      uVar14 = uVar14 + 1;
    } while (uVar21 - (uVar15 & 0xfffffffffffffffc) != uVar14);
  }
  local_48 = firstRowElt;
  if ((uint)local_38 != 0) {
    pIVar4 = (mat->m_data).m_indices;
    pIVar5 = mat->m_outerIndex;
    pIVar6 = mat->m_innerNonZeros;
    uVar21 = 1;
    if (1 < (int)(uint)local_38) {
      uVar21 = local_38 & 0xffffffff;
    }
    uVar14 = 0;
    do {
      iVar22 = (int)uVar14;
      IVar20 = iVar22;
      if (perm != (Index *)0x0) {
        IVar20 = perm[uVar14];
      }
      lVar18 = (long)IVar20;
      iVar23 = pIVar5[lVar18];
      lVar13 = (long)iVar23;
      if (pIVar6 == (Index *)0x0) {
        IVar20 = pIVar5[lVar18 + 1];
      }
      else {
        IVar20 = pIVar6[lVar18] + iVar23;
      }
      if (iVar23 < IVar20) {
        piVar3 = (firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        do {
          lVar18 = (long)pIVar4[lVar13];
          if ((lVar18 < 0) ||
             ((firstRowElt->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= lVar18)) goto LAB_0014d1ab;
          iVar23 = piVar3[lVar18];
          if (iVar22 < iVar23) {
            iVar23 = iVar22;
          }
          piVar3[lVar18] = iVar23;
          lVar13 = lVar13 + 1;
        } while (IVar20 != lVar13);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
    uVar21 = 1;
    if (1 < (int)(uint)local_38) {
      uVar21 = local_38 & 0xffffffff;
    }
    uVar14 = 0;
    do {
      bVar8 = size_00 <= (long)uVar14;
      if (local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar14) {
LAB_0014d1ab:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x18a,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<int, -1, 1>, Level = 1]"
                     );
      }
      iVar22 = (int)uVar14;
      local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar14]
           = iVar22;
      if ((uVar14 == local_38) ||
         (*(int *)((long)local_40 + uVar14 * 4) = iVar22,
         (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
         (long)uVar14)) goto LAB_0014d1ab;
      (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data[uVar14]
           = (int)local_38;
      iVar23 = iVar22;
      if (perm != (Index *)0x0) {
        iVar23 = perm[uVar14];
      }
      pIVar4 = (mat->m_data).m_indices;
      lVar13 = (long)iVar23;
      iVar23 = mat->m_outerIndex[lVar13];
      if (mat->m_innerNonZeros == (Index *)0x0) {
        iVar24 = mat->m_outerIndex[lVar13 + 1];
      }
      else {
        iVar24 = mat->m_innerNonZeros[lVar13] + iVar23;
      }
      bVar9 = iVar24 <= iVar23;
      if ((iVar23 < iVar24) || ((long)uVar14 < size_00)) {
        uVar15 = uVar14 & 0xffffffff;
        lVar13 = (long)iVar23 + 1;
        do {
          uVar16 = uVar14 & 0xffffffff;
          if (!bVar9) {
            uVar16 = (ulong)(uint)pIVar4[lVar13 + -1];
          }
          iVar23 = (int)uVar16;
          if (uVar14 == uVar16) {
            bVar8 = true;
          }
          if ((iVar23 < 0) ||
             ((local_48->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
              m_rows <= (long)iVar23)) goto LAB_0014d1ab;
          iVar23 = (local_48->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage
                   .m_data[iVar23];
          if ((long)iVar23 < (long)uVar14) {
            uVar11 = etree_find<int,Eigen::Matrix<int,_1,1,0,_1,1>>(iVar23,&local_58);
            if ((uint)local_38 <= uVar11) goto LAB_0014d1ab;
            uVar2 = *(uint *)((long)local_40 + (long)(int)uVar11 * 4);
            if (uVar14 != uVar2) {
              if (((int)uVar2 < 0) ||
                 ((parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows <= (long)(int)uVar2)) goto LAB_0014d1ab;
              (parent->super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>).m_storage.m_data
              [(int)uVar2] = iVar22;
              iVar23 = (int)uVar15;
              if ((iVar23 < 0) ||
                 (local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows <= iVar23)) goto LAB_0014d1ab;
              local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [iVar23] = uVar11;
              *(int *)((long)local_40 + (long)(int)uVar11 * 4) = iVar22;
              uVar15 = (ulong)uVar11;
            }
          }
          lVar18 = lVar13 + 1;
          bVar9 = iVar24 <= lVar13;
          bVar7 = lVar13 < iVar24;
          lVar13 = lVar18;
        } while ((bVar7) || (!bVar8));
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar21);
  }
  free(local_58.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_40);
  return 0;
}

Assistant:

int coletree(const MatrixType& mat, IndexVector& parent, IndexVector& firstRowElt, typename MatrixType::Index *perm=0)
{
  typedef typename MatrixType::Index Index;
  Index nc = mat.cols(); // Number of columns 
  Index m = mat.rows();
  Index diagSize = (std::min)(nc,m);
  IndexVector root(nc); // root of subtree of etree 
  root.setZero();
  IndexVector pp(nc); // disjoint sets 
  pp.setZero(); // Initialize disjoint sets 
  parent.resize(mat.cols());
  //Compute first nonzero column in each row 
  Index row,col; 
  firstRowElt.resize(m);
  firstRowElt.setConstant(nc);
  firstRowElt.segment(0, diagSize).setLinSpaced(diagSize, 0, diagSize-1);
  bool found_diag;
  for (col = 0; col < nc; col++)
  {
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it; ++it)
    { 
      row = it.row();
      firstRowElt(row) = (std::min)(firstRowElt(row), col);
    }
  }
  /* Compute etree by Liu's algorithm for symmetric matrices,
          except use (firstRowElt[r],c) in place of an edge (r,c) of A.
    Thus each row clique in A'*A is replaced by a star
    centered at its first vertex, which has the same fill. */
  Index rset, cset, rroot; 
  for (col = 0; col < nc; col++) 
  {
    found_diag = col>=m;
    pp(col) = col; 
    cset = col; 
    root(cset) = col; 
    parent(col) = nc; 
    /* The diagonal element is treated here even if it does not exist in the matrix
     * hence the loop is executed once more */ 
    Index pcol = col;
    if(perm) pcol  = perm[col];
    for (typename MatrixType::InnerIterator it(mat, pcol); it||!found_diag; ++it)
    { //  A sequence of interleaved find and union is performed 
      Index i = col;
      if(it) i = it.index();
      if (i == col) found_diag = true;
      
      row = firstRowElt(i);
      if (row >= col) continue; 
      rset = internal::etree_find(row, pp); // Find the name of the set containing row
      rroot = root(rset);
      if (rroot != col) 
      {
        parent(rroot) = col; 
        pp(cset) = rset; 
        cset = rset; 
        root(cset) = col; 
      }
    }
  }
  return 0;  
}